

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_AttachLinsol
              (ARKodeMem ark_mem,ARKLinsolInitFn linit,ARKLinsolSetupFn lsetup,
              ARKLinsolSolveFn lsolve,ARKLinsolFreeFn lfree,SUNLinearSolver_Type lsolve_type,
              void *lmem)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x9a4,"arkStep_AttachLinsol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    if (*(code **)((long)pvVar1 + 0x138) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x138))(ark_mem);
    }
    *(ARKLinsolInitFn *)((long)pvVar1 + 0x120) = linit;
    *(ARKLinsolSetupFn *)((long)pvVar1 + 0x128) = lsetup;
    *(ARKLinsolSolveFn *)((long)pvVar1 + 0x130) = lsolve;
    *(ARKLinsolFreeFn *)((long)pvVar1 + 0x138) = lfree;
    *(void **)((long)pvVar1 + 0x140) = lmem;
    *(SUNLinearSolver_Type *)((long)pvVar1 + 0x148) = lsolve_type;
    iVar2 = 0;
    *(undefined8 *)((long)pvVar1 + 0x198) = 0;
    *(undefined8 *)((long)pvVar1 + 0x100) = 0;
  }
  return iVar2;
}

Assistant:

int arkStep_AttachLinsol(ARKodeMem ark_mem, ARKLinsolInitFn linit,
                         ARKLinsolSetupFn lsetup, ARKLinsolSolveFn lsolve,
                         ARKLinsolFreeFn lfree,
                         SUNLinearSolver_Type lsolve_type, void* lmem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing system solver */
  if (step_mem->lfree != NULL) { step_mem->lfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->linit       = linit;
  step_mem->lsetup      = lsetup;
  step_mem->lsolve      = lsolve;
  step_mem->lfree       = lfree;
  step_mem->lmem        = lmem;
  step_mem->lsolve_type = lsolve_type;

  /* Reset all linear solver counters */
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return (ARK_SUCCESS);
}